

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_hsort(size_t element_len)

{
  uint32_t uVar1;
  long *extraout_RDX;
  long lVar2;
  int iVar3;
  long lVar4;
  uchar *__s;
  size_t count;
  test_hsort_cmp_data data;
  uchar elements [4225];
  ulong local_10c8;
  size_t local_10c0;
  uchar local_10b8 [4232];
  
  __s = local_10b8;
  memset(__s,0,0x1081);
  local_10c8 = 0;
  lVar4 = 0x41;
  local_10c0 = element_len;
  secp256k1_hsort(__s,0x41,element_len,test_hsort_cmp,&local_10c8);
  if (0x3f < local_10c8) {
    test_hsort_is_sorted(local_10b8,0x41,element_len);
    if (0 < COUNT) {
      iVar3 = 0;
      do {
        uVar1 = testrand_int(0x41);
        count = (size_t)(int)uVar1;
        testrand_bytes_test(local_10b8,count * element_len);
        secp256k1_hsort(local_10b8,count,element_len,test_hsort_cmp,&local_10c8);
        test_hsort_is_sorted(local_10b8,count,element_len);
        iVar3 = iVar3 + 1;
      } while (iVar3 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar2 = 0;
    do {
      if (__s[lVar2] != *(uchar *)(lVar4 + lVar2)) {
        return;
      }
      lVar2 = lVar2 + 1;
    } while (extraout_RDX[1] != lVar2);
  }
  return;
}

Assistant:

static void test_hsort(size_t element_len) {
    unsigned char elements[NUM * MAX_ELEMENT_LEN] = { 0 };
    struct test_hsort_cmp_data data;
    int i;

    VERIFY_CHECK(element_len <= MAX_ELEMENT_LEN);
    data.counter = 0;
    data.element_len = element_len;

    secp256k1_hsort(elements, 0, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, 1, element_len, test_hsort_cmp, &data);
    CHECK(data.counter == 0);
    secp256k1_hsort(elements, NUM, element_len, test_hsort_cmp, &data);
    CHECK(data.counter >= NUM - 1);
    test_hsort_is_sorted(elements, NUM, element_len);

    /* Test hsort with array of random length n */
    for (i = 0; i < COUNT; i++) {
        int n = testrand_int(NUM);
        testrand_bytes_test(elements, n*element_len);
        secp256k1_hsort(elements, n, element_len, test_hsort_cmp, &data);
        test_hsort_is_sorted(elements, n, element_len);
    }
}